

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O1

void __thiscall
PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
          (ImageTemplate<unsigned_char> *this,uint32_t width_,uint32_t height_,uint8_t colorCount_,
          uint8_t alignment_)

{
  byte bVar1;
  pointer pp_Var2;
  FunctionFacade *pFVar3;
  
  this->_vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00125c30;
  this->_width = 0;
  this->_height = 0;
  this->_colorCount = '\x01';
  this->_alignment = '\x01';
  this->_rowSize = 0;
  this->_data = (uchar *)0x0;
  this->_type = '\0';
  pFVar3 = FunctionFacade::instance();
  bVar1 = this->_type;
  pp_Var2 = (pFVar3->_allocate).
            super__Vector_base<unsigned_char_*(*)(unsigned_long),_std::allocator<unsigned_char_*(*)(unsigned_long)>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pp_Var2[bVar1] == (_func_uchar_ptr_unsigned_long *)0x0) {
    pp_Var2[bVar1] = _allocateMemory;
    (pFVar3->_deallocate).
    super__Vector_base<void_(*)(unsigned_char_*),_std::allocator<void_(*)(unsigned_char_*)>_>.
    _M_impl.super__Vector_impl_data._M_start[bVar1] = _deallocateMemory;
    (pFVar3->_copy).
    super__Vector_base<void_(*)(unsigned_char_*,_unsigned_char_*,_unsigned_long),_std::allocator<void_(*)(unsigned_char_*,_unsigned_char_*,_unsigned_long)>_>
    ._M_impl.super__Vector_impl_data._M_start[bVar1] = _copyMemory;
    (pFVar3->_set).
    super__Vector_base<void_(*)(unsigned_char_*,_unsigned_char,_unsigned_long),_std::allocator<void_(*)(unsigned_char_*,_unsigned_char,_unsigned_long)>_>
    ._M_impl.super__Vector_impl_data._M_start[bVar1] = _setMemory;
  }
  if ((colorCount_ != '\0') && (this->_colorCount != colorCount_)) {
    clear(this);
    this->_colorCount = colorCount_;
  }
  if ((alignment_ != '\0') && (this->_alignment != alignment_)) {
    clear(this);
    this->_alignment = alignment_;
  }
  resize(this,width_,height_);
  return;
}

Assistant:

ImageTemplate( uint32_t width_ = 0u, uint32_t height_ = 0u, uint8_t colorCount_ = 1u, uint8_t alignment_ = 1u )
            : _width     ( 0 )       // width of image
            , _height    ( 0 )       // height of image
            , _colorCount( 1 )       // number of colors per pixel
            , _alignment ( 1 )       // some formats require that row size must be a multiple of some value (alignment)
                                     // for example for Bitmap it must be a multiple of 4
            , _rowSize   ( 0 )       // size of single row on image, usually it is equal to width
            , _data      ( nullptr ) // an array what store image information (pixel data)
            , _type      ( 0 )       // special attribute to specify different types of images based on technology it is used for
        {
            _setType();

            setColorCount( colorCount_ );
            setAlignment( alignment_ );
            resize( width_, height_ );
        }